

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::MatrixInverse::forward_impl
          (MatrixInverse *this,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  long in_RDX;
  Tensor *in_stack_00000038;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_stack_00000040;
  Device_CPU *in_stack_00000048;
  MatrixInverse *in_stack_00000050;
  
  if (*(long *)(in_RDX + 0x48) == 0) {
    __assert_fail("fx.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x444,
                  "virtual void dynet::MatrixInverse::forward_impl(const std::vector<const Tensor *> &, Tensor &) const"
                 );
  }
  if (*(int *)(*(long *)(in_RDX + 0x48) + 0xc) == 0) {
    forward_dev_impl<dynet::Device_CPU>
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
    return;
  }
  abort();
}

Assistant:

void MatrixMultiply::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() == 2);
#ifdef __CUDACC__
  // fx = 0*fx + xs[0] * xs[1]
  CUDAMatrixMultiply(dev, *xs[0], *xs[1], fx, kSCALAR_ZERO);
#else
  assert(fx.d.bd == max(xs[0]->d.bd, xs[1]->d.bd));
  if(xs[0]->d.bd == 1) {
    // If the left side has one batch, multiply by columns
    // [x, z, b] = [x, y] * [y, z, b]
    // -> [x, z*b] = [x, y], [y, z*b]
    fx.colbatch_matrix().noalias() = **xs[0] * xs[1]->colbatch_matrix();
  } else {
    // Otherwise, loop over the batches
    assert(xs[1]->d.bd == 1 || xs[1]->d.bd == xs[0]->d.bd);
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      fx.batch_matrix(b).noalias() = xs[0]->batch_matrix(b) * xs[1]->batch_matrix(b);
  }
#endif
}